

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int translate_code(lemon *lemp,rule *rp)

{
  byte bVar1;
  char *pcVar2;
  ushort *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  char **ppcVar9;
  ushort **ppuVar10;
  size_t sVar11;
  symbol *psVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  int n;
  byte *pbVar16;
  byte *__s1;
  long lVar17;
  bool bVar18;
  bool bVar19;
  char zLhs [50];
  char used [1000];
  char zOvwrt [900];
  uint local_800;
  char local_7e8 [64];
  char local_7a8 [1008];
  char local_3b8 [904];
  
  iVar5 = rp->nrhs;
  if (0 < (long)iVar5) {
    memset(local_7a8,0,(long)iVar5);
  }
  bVar18 = rp->code == (char *)0x0;
  if (bVar18) {
    rp->code = translate_code::newlinestr;
    rp->line = rp->ruleline;
  }
  rp->noCode = (uint)bVar18;
  if (iVar5 == 0) {
LAB_0010b146:
    bVar18 = false;
  }
  else {
    pcVar13 = *rp->rhsalias;
    if (pcVar13 == (char *)0x0) {
      if ((*rp->rhs)->type == TERMINAL) {
        ppcVar9 = &lemp->tokendest;
LAB_0010b0b4:
        if (*ppcVar9 == (char *)0x0) goto LAB_0010b146;
      }
      else if (lemp->vardest == (char *)0x0) {
        ppcVar9 = &(*rp->rhs)->destructor;
        goto LAB_0010b0b4;
      }
      if (append_str::z != (char *)0x0 && append_str::used == 0) {
        *append_str::z = '\0';
      }
      append_str::used = 0;
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,(*rp->rhs)->index,
                 1 - rp->nrhs);
      pcVar13 = append_str::z;
      if (append_str::z != (char *)0x0 && append_str::used == 0) {
        *append_str::z = '\0';
      }
      append_str::used = 0;
      pcVar13 = Strsafe(pcVar13);
      rp->codePrefix = pcVar13;
      rp->noCode = LEMON_FALSE;
      goto LAB_0010b146;
    }
    pcVar2 = rp->lhsalias;
    if (pcVar2 == (char *)0x0) goto LAB_0010b146;
    iVar5 = strcmp(pcVar2,pcVar13);
    if (iVar5 != 0) {
      bVar18 = false;
      lemon_sprintf(local_3b8,"/*%s-overwrites-%s*/",pcVar2,pcVar13);
      pbVar8 = (byte *)strstr(rp->code,local_3b8);
      bVar19 = pbVar8 == (byte *)0x0;
      goto LAB_0010b151;
    }
    local_7a8[0] = '\x01';
    bVar18 = true;
    if (rp->lhs->dtnum != (*rp->rhs)->dtnum) {
      ErrorMsg(lemp->filename,rp->ruleline,
               "%s(%s) and %s(%s) share the same label but have different datatypes.",rp->lhs->name,
               pcVar2,(*rp->rhs)->name,pcVar13);
      lemp->errorcnt = lemp->errorcnt + 1;
    }
  }
  pbVar8 = (byte *)0x0;
  bVar19 = false;
LAB_0010b151:
  if (!bVar19) {
    sprintf(local_7e8,"yymsp[%d].minor.yy%d",(ulong)(1 - rp->nrhs),(ulong)(uint)rp->lhs->dtnum);
  }
  else {
    sprintf(local_7e8,"yylhsminor.yy%d",(ulong)(uint)rp->lhs->dtnum);
  }
  local_800 = (uint)bVar19;
  if (append_str::z != (char *)0x0 && append_str::used == 0) {
    *append_str::z = '\0';
  }
  append_str::used = 0;
  __s1 = (byte *)rp->code;
  bVar1 = *__s1;
  if (bVar1 != 0) {
    bVar4 = false;
    do {
      if (__s1 == pbVar8) {
        append_str(local_3b8,0,0,0);
        sVar11 = strlen(local_3b8);
        __s1 = __s1 + ((int)sVar11 + -1);
        bVar4 = true;
      }
      else {
        ppuVar10 = __ctype_b_loc();
        puVar3 = *ppuVar10;
        if (((*(byte *)((long)puVar3 + (ulong)bVar1 * 2 + 1) & 4) != 0) &&
           ((pbVar16 = __s1, __s1 == (byte *)rp->code ||
            ((__s1[-1] != 0x5f && ((puVar3[__s1[-1]] & 8) == 0)))))) {
          do {
            do {
              bVar1 = pbVar16[1];
              pbVar16 = pbVar16 + 1;
            } while (bVar1 == 0x5f);
          } while ((puVar3[bVar1] & 8) != 0);
          *pbVar16 = 0;
          if ((rp->lhsalias == (char *)0x0) ||
             (iVar5 = strcmp((char *)__s1,rp->lhsalias), iVar5 != 0)) {
            iVar5 = rp->nrhs;
            if (0 < (long)iVar5) {
              ppcVar9 = rp->rhsalias;
              lVar15 = 0;
              do {
                pcVar13 = ppcVar9[lVar15];
                if ((pcVar13 != (char *)0x0) && (iVar6 = strcmp((char *)__s1,pcVar13), iVar6 == 0))
                {
                  if (bVar4 && lVar15 == 0) {
                    ErrorMsg(lemp->filename,rp->ruleline,"Label %s used after \'%s\'.",*ppcVar9,
                             local_3b8);
                    lemp->errorcnt = lemp->errorcnt + 1;
                  }
                  else {
                    if ((__s1 == (byte *)rp->code) || (__s1[-1] != 0x40)) {
                      psVar12 = rp->rhs[lVar15];
                      if (psVar12->type == MULTITERMINAL) {
                        psVar12 = *psVar12->subsym;
                      }
                      iVar6 = psVar12->dtnum;
                      pcVar13 = "yymsp[%d].minor.yy%d";
                      n = 0;
                    }
                    else {
                      pcVar13 = "yymsp[%d].major";
                      n = -1;
                      iVar6 = 0;
                    }
                    append_str(pcVar13,n,((int)lVar15 - iVar5) + 1,iVar6);
                  }
                  local_7a8[lVar15] = '\x01';
                  __s1 = pbVar16;
                  break;
                }
                lVar15 = lVar15 + 1;
              } while (iVar5 != lVar15);
            }
          }
          else {
            append_str(local_7e8,0,0,0);
            bVar18 = true;
            __s1 = pbVar16;
          }
          *pbVar16 = bVar1;
        }
        append_str((char *)__s1,1,0,0);
      }
      bVar1 = __s1[1];
      __s1 = __s1 + 1;
    } while (bVar1 != 0);
  }
  pcVar13 = append_str::z;
  if (append_str::z != (char *)0x0 && append_str::used == 0) {
    *append_str::z = '\0';
  }
  append_str::used = 0;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
    pcVar13 = Strsafe(pcVar13);
    rp->code = pcVar13;
  }
  if (append_str::z != (char *)0x0 && append_str::used == 0) {
    *append_str::z = '\0';
  }
  append_str::used = 0;
  if (!bVar18 && rp->lhsalias != (char *)0x0) {
    translate_code_cold_1();
  }
  uVar7 = rp->nrhs;
  uVar14 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar15 = 0;
    do {
      pcVar13 = rp->rhsalias[lVar15];
      if (pcVar13 == (char *)0x0) {
        if (lVar15 != 0) {
          psVar12 = rp->rhs[lVar15];
          ppcVar9 = &lemp->tokendest;
          if (psVar12->type == TERMINAL) {
LAB_0010b54b:
            if (*ppcVar9 == (char *)0x0) goto LAB_0010b569;
          }
          else if (lemp->vardest == (char *)0x0) {
            ppcVar9 = &psVar12->destructor;
            goto LAB_0010b54b;
          }
          append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,psVar12->index,
                     ((int)lVar15 - (int)uVar14) + 1);
        }
      }
      else {
        if (lVar15 != 0) {
          if ((rp->lhsalias != (char *)0x0) && (iVar5 = strcmp(rp->lhsalias,pcVar13), iVar5 == 0)) {
            ErrorMsg(lemp->filename,rp->ruleline,
                     "%s(%s) has the same label as the LHS but is not the left-most symbol on the RHS."
                     ,rp->rhs[lVar15]->name,pcVar13);
            lemp->errorcnt = lemp->errorcnt + 1;
          }
          ppcVar9 = rp->rhsalias;
          lVar17 = 0;
          do {
            pcVar13 = ppcVar9[lVar17];
            if (pcVar13 != (char *)0x0) {
              pcVar2 = ppcVar9[lVar15];
              iVar5 = strcmp(pcVar13,pcVar2);
              if (iVar5 == 0) {
                ErrorMsg(lemp->filename,rp->ruleline,
                         "Label %s used for multiple symbols on the RHS of a rule.",pcVar2);
                lemp->errorcnt = lemp->errorcnt + 1;
                break;
              }
            }
            lVar17 = lVar17 + 1;
          } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
        }
        if (local_7a8[lVar15] == '\0') {
          ErrorMsg(lemp->filename,rp->ruleline,"Label %s for \"%s(%s)\" is never used.",
                   rp->rhsalias[lVar15],rp->rhs[lVar15]->name,rp->rhsalias[lVar15]);
          lemp->errorcnt = lemp->errorcnt + 1;
        }
      }
LAB_0010b569:
      lVar15 = lVar15 + 1;
      uVar7 = rp->nrhs;
      uVar14 = (ulong)(int)uVar7;
    } while (lVar15 < (long)uVar14);
  }
  if (bVar19) {
    append_str("  yymsp[%d].minor.yy%d = ",0,1 - uVar7,rp->lhs->dtnum);
    append_str(local_7e8,0,0,0);
    append_str(";\n",0,0,0);
  }
  pcVar13 = append_str::z;
  if (append_str::z != (char *)0x0 && append_str::used == 0) {
    *append_str::z = '\0';
  }
  append_str::used = 0;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
    pcVar13 = Strsafe(pcVar13);
    rp->codeSuffix = pcVar13;
    rp->noCode = LEMON_FALSE;
  }
  return local_800;
}

Assistant:

PRIVATE int translate_code(struct lemon *lemp, struct rule *rp){
  char *cp, *xp;
  int i;
  int rc = 0;            /* True if yylhsminor is used */
  int dontUseRhs0 = 0;   /* If true, use of left-most RHS label is illegal */
  const char *zSkip = 0; /* The zOvwrt comment within rp->code, or NULL */
  char lhsused = 0;      /* True if the LHS element has been used */
  char lhsdirect;        /* True if LHS writes directly into stack */
  char used[MAXRHS];     /* True for each RHS element which is used */
  char zLhs[50];         /* Convert the LHS symbol into this string */
  char zOvwrt[900];      /* Comment that to allow LHS to overwrite RHS */

  for(i=0; i<rp->nrhs; i++) used[i] = 0;
  lhsused = 0;

  if( rp->code==0 ){
    static char newlinestr[2] = { '\n', '\0' };
    rp->code = newlinestr;
    rp->line = rp->ruleline;
    rp->noCode = 1;
  }else{
    rp->noCode = 0;
  }


  if( rp->nrhs==0 ){
    /* If there are no RHS symbols, then writing directly to the LHS is ok */
    lhsdirect = 1;
  }else if( rp->rhsalias[0]==0 ){
    /* The left-most RHS symbol has no value.  LHS direct is ok.  But
    ** we have to call the distructor on the RHS symbol first. */
    lhsdirect = 1;
    if( has_destructor(rp->rhs[0],lemp) ){
      append_str(0,0,0,0);
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
                 rp->rhs[0]->index,1-rp->nrhs);
      rp->codePrefix = Strsafe(append_str(0,0,0,0));
      rp->noCode = 0;
    }
  }else if( rp->lhsalias==0 ){
    /* There is no LHS value symbol. */
    lhsdirect = 1;
  }else if( strcmp(rp->lhsalias,rp->rhsalias[0])==0 ){
    /* The LHS symbol and the left-most RHS symbol are the same, so
    ** direct writing is allowed */
    lhsdirect = 1;
    lhsused = 1;
    used[0] = 1;
    if( rp->lhs->dtnum!=rp->rhs[0]->dtnum ){
      ErrorMsg(lemp->filename,rp->ruleline,
        "%s(%s) and %s(%s) share the same label but have "
        "different datatypes.",
        rp->lhs->name, rp->lhsalias, rp->rhs[0]->name, rp->rhsalias[0]);
      lemp->errorcnt++;
    }
  }else{
    lemon_sprintf(zOvwrt, "/*%s-overwrites-%s*/",
                  rp->lhsalias, rp->rhsalias[0]);
    zSkip = strstr(rp->code, zOvwrt);
    if( zSkip!=0 ){
      /* The code contains a special comment that indicates that it is safe
      ** for the LHS label to overwrite left-most RHS label. */
      lhsdirect = 1;
    }else{
      lhsdirect = 0;
    }
  }
  if( lhsdirect ){
    sprintf(zLhs, "yymsp[%d].minor.yy%d",1-rp->nrhs,rp->lhs->dtnum);
  }else{
    rc = 1;
    sprintf(zLhs, "yylhsminor.yy%d",rp->lhs->dtnum);
  }

  append_str(0,0,0,0);

  /* This const cast is wrong but harmless, if we're careful. */
  for(cp=(char *)rp->code; *cp; cp++){
    if( cp==zSkip ){
      append_str(zOvwrt,0,0,0);
      cp += lemonStrlen(zOvwrt)-1;
      dontUseRhs0 = 1;
      continue;
    }
    if( ISALPHA(*cp) && (cp==rp->code || (!ISALNUM(cp[-1]) && cp[-1]!='_')) ){
      char saved;
      for(xp= &cp[1]; ISALNUM(*xp) || *xp=='_'; xp++);
      saved = *xp;
      *xp = 0;
      if( rp->lhsalias && strcmp(cp,rp->lhsalias)==0 ){
        append_str(zLhs,0,0,0);
        cp = xp;
        lhsused = 1;
      }else{
        for(i=0; i<rp->nrhs; i++){
          if( rp->rhsalias[i] && strcmp(cp,rp->rhsalias[i])==0 ){
            if( i==0 && dontUseRhs0 ){
              ErrorMsg(lemp->filename,rp->ruleline,
                 "Label %s used after '%s'.",
                 rp->rhsalias[0], zOvwrt);
              lemp->errorcnt++;
            }else if( cp!=rp->code && cp[-1]=='@' ){
              /* If the argument is of the form @X then substituted
              ** the token number of X, not the value of X */
              append_str("yymsp[%d].major",-1,i-rp->nrhs+1,0);
            }else{
              struct symbol *sp = rp->rhs[i];
              int dtnum;
              if( sp->type==MULTITERMINAL ){
                dtnum = sp->subsym[0]->dtnum;
              }else{
                dtnum = sp->dtnum;
              }
              append_str("yymsp[%d].minor.yy%d",0,i-rp->nrhs+1, dtnum);
            }
            cp = xp;
            used[i] = 1;
            break;
          }
        }
      }
      *xp = saved;
    }
    append_str(cp, 1, 0, 0);
  } /* End loop */

  /* Main code generation completed */
  cp = append_str(0,0,0,0);
  if( cp && cp[0] ) rp->code = Strsafe(cp);
  append_str(0,0,0,0);

  /* Check to make sure the LHS has been used */
  if( rp->lhsalias && !lhsused ){
    ErrorMsg(lemp->filename,rp->ruleline,
      "Label \"%s\" for \"%s(%s)\" is never used.",
        rp->lhsalias,rp->lhs->name,rp->lhsalias);
    lemp->errorcnt++;
  }

  /* Generate destructor code for RHS minor values which are not referenced.
  ** Generate error messages for unused labels and duplicate labels.
  */
  for(i=0; i<rp->nrhs; i++){
    if( rp->rhsalias[i] ){
      if( i>0 ){
        int j;
        if( rp->lhsalias && strcmp(rp->lhsalias,rp->rhsalias[i])==0 ){
          ErrorMsg(lemp->filename,rp->ruleline,
            "%s(%s) has the same label as the LHS but is not the left-most "
            "symbol on the RHS.",
            rp->rhs[i]->name, rp->rhsalias[i]);
          lemp->errorcnt++;
        }
        for(j=0; j<i; j++){
          if( rp->rhsalias[j] && strcmp(rp->rhsalias[j],rp->rhsalias[i])==0 ){
            ErrorMsg(lemp->filename,rp->ruleline,
              "Label %s used for multiple symbols on the RHS of a rule.",
              rp->rhsalias[i]);
            lemp->errorcnt++;
            break;
          }
        }
      }
      if( !used[i] ){
        ErrorMsg(lemp->filename,rp->ruleline,
          "Label %s for \"%s(%s)\" is never used.",
          rp->rhsalias[i],rp->rhs[i]->name,rp->rhsalias[i]);
        lemp->errorcnt++;
      }
    }else if( i>0 && has_destructor(rp->rhs[i],lemp) ){
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
         rp->rhs[i]->index,i-rp->nrhs+1);
    }
  }

  /* If unable to write LHS values directly into the stack, write the
  ** saved LHS value now. */
  if( lhsdirect==0 ){
    append_str("  yymsp[%d].minor.yy%d = ", 0, 1-rp->nrhs, rp->lhs->dtnum);
    append_str(zLhs, 0, 0, 0);
    append_str(";\n", 0, 0, 0);
  }

  /* Suffix code generation complete */
  cp = append_str(0,0,0,0);
  if( cp && cp[0] ){
    rp->codeSuffix = Strsafe(cp);
    rp->noCode = 0;
  }

  return rc;
}